

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int i2c_read_block_data(uint handle,uint reg,char *buf)

{
  undefined8 in_RDX;
  int in_ESI;
  int in_EDI;
  int unaff_retaddr;
  int bytes;
  int in_stack_00000ff8;
  int in_stack_00000ffc;
  void *in_stack_00001000;
  int local_14;
  
  local_14 = pigpio_command(unaff_retaddr,in_EDI,in_ESI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  if (0 < local_14) {
    local_14 = recvMax(in_stack_00001000,in_stack_00000ffc,in_stack_00000ff8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return local_14;
}

Assistant:

int i2c_read_block_data(unsigned handle, unsigned reg, char *buf)
{
   int bytes;

   bytes = pigpio_command(gPigCommand, PI_CMD_I2CRK, handle, reg, 0);

   if (bytes > 0)
   {
      bytes = recvMax(buf, 32, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}